

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O2

void hta::storage::file::check_hta
               (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *file,Duration interval
               ,TimePoint raw_epoch,TimePoint raw_end,bool fast)

{
  duration *pdVar1;
  Value *pVVar2;
  uint64_t *puVar3;
  void *pvVar4;
  TimePoint TVar5;
  duration dVar6;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tVar7;
  ostream *poVar8;
  long lVar9;
  size_type __new_size;
  size_t sub_index;
  ulong uVar10;
  long lVar11;
  void *__buf;
  duration local_c0;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> data;
  value_type ta;
  
  pvVar4 = (void *)File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::size(file);
  TVar5 = interval_begin(raw_epoch,interval);
  data.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::reserve(&data,0x1000);
  std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::resize(&data,1);
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::read
            (file,(int)&data,(void *)((long)pvVar4 - 1),0);
  lVar9 = ((data.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl
            .super__Vector_impl_data._M_start)->time).
          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
          __d.__r;
  dVar6.__r = (rep)interval_begin(raw_end,interval);
  if (lVar9 + interval.__r != dVar6.__r) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error: Invalid last interval timestamp: ");
    std::ostream::_M_insert<long>((long)poVar8);
    poVar8 = std::operator<<(poVar8,", expected: ");
    interval_begin(raw_end,interval);
    std::ostream::_M_insert<long>((long)poVar8);
    poVar8 = std::operator<<(poVar8,", raw_end: ");
    std::ostream::_M_insert<long>((long)poVar8);
    poVar8 = std::operator<<(poVar8,", interval: ");
    poVar8 = std::ostream::_M_insert<long>((long)poVar8);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  __buf = (void *)((long)pvVar4 - 0x1000);
  if (!fast) {
    __buf = (void *)0x0;
  }
  local_c0.__r = 0;
  if (pvVar4 < (void *)0x1001) {
    __buf = (void *)0x0;
  }
  lVar9 = (long)TVar5.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r + (long)__buf * interval.__r;
  while( true ) {
    __new_size = (long)pvVar4 - (long)__buf;
    if (pvVar4 < __buf || __new_size == 0) break;
    if (0xfff < __new_size) {
      __new_size = 0x1000;
    }
    std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::resize(&data,__new_size);
    File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::read(file,(int)&data,__buf,0);
    lVar11 = 0;
    dVar6.__r = lVar9;
    for (uVar10 = 0;
        uVar10 < (ulong)(((long)data.
                                super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)data.
                               super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x38);
        uVar10 = uVar10 + 1) {
      pdVar1 = (duration *)
               ((long)&((data.
                         super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                         ._M_impl.super__Vector_impl_data._M_start)->time).
                       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       .__d.__r + lVar11);
      ta.time.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            pdVar1->__r;
      ta.aggregate.minimum = (Value)pdVar1[1].__r;
      pVVar2 = (Value *)((long)&((data.
                                  super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->aggregate).maximum +
                        lVar11);
      ta.aggregate.maximum = *pVVar2;
      ta.aggregate.sum = pVVar2[1];
      puVar3 = (uint64_t *)
               ((long)&((data.
                         super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                         ._M_impl.super__Vector_impl_data._M_start)->aggregate).count + lVar11);
      ta.aggregate.count = *puVar3;
      ta.aggregate.integral = (Value)puVar3[1];
      ta.aggregate.active_time.__r =
           *(rep *)((long)&((data.
                             super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                             ._M_impl.super__Vector_impl_data._M_start)->aggregate).active_time.__r
                   + lVar11);
      tVar7.__d.__r = (duration)(duration)dVar6.__r;
      if ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
          dVar6.__r !=
          ta.time.
          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
          __d.__r) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error: [");
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        poVar8 = std::operator<<(poVar8,"] bogus time, expected: ");
        std::ostream::_M_insert<long>((long)poVar8);
        poVar8 = std::operator<<(poVar8,", actual: ");
        std::ostream::_M_insert<long>((long)poVar8);
        std::endl<char,std::char_traits<char>>(poVar8);
        tVar7.__d.__r = (duration)(duration)ta.time;
      }
      if ((long)tVar7.__d.__r < local_c0.__r) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error: [");
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        poVar8 = std::operator<<(poVar8,"] non-monotonous time ");
        std::ostream::_M_insert<long>((long)poVar8);
        poVar8 = std::operator<<(poVar8," follows ");
        std::ostream::_M_insert<long>((long)poVar8);
        std::endl<char,std::char_traits<char>>(poVar8);
        tVar7.__d.__r = (duration)(duration)local_c0.__r;
      }
      else if (tVar7.__d.__r == (duration)local_c0.__r) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error: [");
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        poVar8 = std::operator<<(poVar8,"] duplicate time ");
        std::ostream::_M_insert<long>((long)poVar8);
        std::endl<char,std::char_traits<char>>(poVar8);
        tVar7.__d.__r = (duration)(duration)local_c0.__r;
      }
      local_c0 = tVar7.__d.__r;
      if ((((0x7fefffffffffffff < (ulong)ABS(ta.aggregate.integral)) ||
           (0x7fefffffffffffff < (ulong)ABS(ta.aggregate.maximum))) ||
          (0x7fefffffffffffff < (ulong)ABS(ta.aggregate.minimum))) ||
         (0x7fefffffffffffff < (ulong)ABS(ta.aggregate.sum))) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Warning: [");
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        poVar8 = std::operator<<(poVar8,"] non-finite aggregate ");
        poVar8 = operator<<(poVar8,&ta.aggregate);
        poVar8 = std::operator<<(poVar8," at ");
        std::ostream::_M_insert<long>((long)poVar8);
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      lVar11 = lVar11 + 0x38;
      dVar6.__r = dVar6.__r + interval.__r;
    }
    __buf = (void *)((long)__buf + 0x1000);
    lVar9 = lVar9 + interval.__r * 0x1000;
  }
  poVar8 = std::operator<<((ostream *)&std::cout,"Finished check of ");
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  poVar8 = std::operator<<(poVar8," entries: ");
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  poVar8 = std::operator<<(poVar8," issues.");
  std::endl<char,std::char_traits<char>>(poVar8);
  std::_Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::~_Vector_base
            (&data.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>);
  return;
}

Assistant:

void check_hta(File<Metric::Header, TimeAggregate>& file, Duration interval, TimePoint raw_epoch,
               TimePoint raw_end, bool fast = false)
{
    auto size = file.size();
    auto epoch = interval_begin(raw_epoch, interval);

    TimePoint previous_time;
    std::vector<TimeAggregate> data;
    data.reserve(chunk_size);

    size_t issue_count = 0;

    // check last chunk consistency
    data.resize(1);
    file.read(data, size - 1);
    if (data[0].time + interval != interval_begin(raw_end, interval))
    {
        std::cerr << "Error: Invalid last interval timestamp: " << data[0].time
                  << ", expected: " << interval_begin(raw_end, interval) << ", raw_end: " << raw_end
                  << ", interval: " << interval.count() << std::endl;
        issue_count++;
    }

    size_t chunk_begin = 0;
    if (fast && size > chunk_size)
    {
        chunk_begin = size - chunk_size;
    }
    for (; chunk_begin < size; chunk_begin += chunk_size)
    {
        data.resize(std::min(chunk_size, size - chunk_begin));
        file.read(data, chunk_begin);
        for (size_t sub_index = 0; sub_index < data.size(); sub_index++)
        {
            auto ta = data[sub_index];
            auto index = chunk_begin + sub_index;

            auto expected_time = epoch + interval * index;
            if (expected_time != ta.time)
            {
                std::cerr << "Error: [" << index << "] bogus time, expected: " << expected_time
                          << ", actual: " << ta.time << std::endl;
                issue_count++;
            }
            if (ta.time < previous_time)
            {
                std::cerr << "Error: [" << index << "] non-monotonous time " << ta.time
                          << " follows " << previous_time << std::endl;
                issue_count++;
            }
            else if (ta.time == previous_time)
            {
                std::cerr << "Error: [" << index << "] duplicate time " << ta.time << std::endl;
                issue_count++;
            }
            else
            {
                previous_time = ta.time;
            }

            if (!std::isfinite(ta.aggregate.integral) || !std::isfinite(ta.aggregate.maximum) ||
                !std::isfinite(ta.aggregate.minimum) || !std::isfinite(ta.aggregate.sum))
            {
                std::cerr << "Warning: [" << index << "] non-finite aggregate " << ta.aggregate
                          << " at " << ta.time << std::endl;
                issue_count++;
            }
        }
    }
    std::cout << "Finished check of " << size << " entries: " << issue_count << " issues."
              << std::endl;
}